

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<false,_false,_true>::optimizeLocalGet
          (SimplifyLocals<false,_false,_true> *this,LocalGet *curr)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  LocalSet *this_00;
  reference pvVar4;
  Function *this_01;
  Type type_;
  LocalGet *get;
  bool oneUse;
  LocalSet *set;
  _Self local_20;
  iterator found;
  LocalGet *curr_local;
  SimplifyLocals<false,_false,_true> *this_local;
  
  found._M_node = (_Base_ptr)curr;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo>_>_>
       ::find(&this->sinkables,&curr->index);
  set = (LocalSet *)
        std::
        map<unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo>_>_>
        ::end(&this->sinkables);
  bVar2 = std::operator!=(&local_20,(_Self *)&set);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo>_>
             ::operator->(&local_20);
    this_00 = Expression::cast<wasm::LocalSet>(*(ppVar3->second).item);
    bVar2 = true;
    if ((this->firstCycle & 1U) == 0) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&(this->getCounter).num,(ulong)*(uint *)&(found._M_node)->_M_left);
      bVar2 = *pvVar4 == 1;
    }
    Expression::dynCast<wasm::LocalGet>(this_00->value);
    if (bVar2) {
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::replaceCurrent((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                       ,this_00->value);
      bVar2 = wasm::Type::operator!=(&this_00->value->type,(Type *)&(found._M_node)->_M_parent);
      if (bVar2) {
        this->refinalize = true;
      }
    }
    else {
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::replaceCurrent((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                       ,(Expression *)this_00);
      bVar2 = LocalSet::isTee(this_00);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!set->isTee()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x119,
                      "void wasm::SimplifyLocals<false, false>::optimizeLocalGet(LocalGet *) [allowTee = false, allowStructure = false, allowNesting = true]"
                     );
      }
      this_01 = Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::getFunction((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                               *)&(this->
                                  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                                  ).
                                  super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                             );
      type_ = Function::getLocalType(this_01,this_00->index);
      LocalSet::makeTee(this_00,type_);
    }
    iVar1._M_node = found._M_node;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo>_>
             ::operator->(&local_20);
    *(ppVar3->second).item = (Expression *)iVar1._M_node;
    ExpressionManipulator::nop<wasm::LocalGet>((LocalGet *)found._M_node);
    std::
    map<unsigned_int,wasm::SimplifyLocals<false,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<false,false,true>::SinkableInfo>>>
    ::erase_abi_cxx11_((map<unsigned_int,wasm::SimplifyLocals<false,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<false,false,true>::SinkableInfo>>>
                        *)&this->sinkables,(iterator)local_20._M_node);
    this->anotherCycle = true;
  }
  return;
}

Assistant:

void optimizeLocalGet(LocalGet* curr) {
    auto found = sinkables.find(curr->index);
    if (found != sinkables.end()) {
      auto* set = (*found->second.item)
                    ->template cast<LocalSet>(); // the set we may be sinking
      bool oneUse = firstCycle || getCounter.num[curr->index] == 1;
      // the set's value may be a get (i.e., the set is a copy)
      auto* get = set->value->template dynCast<LocalGet>();
      // if nesting is not allowed, and this might cause nesting, check if the
      // sink would cause such a thing
      if (!allowNesting) {
        // a get is always ok to sink
        if (!get) {
          assert(expressionStack.size() >= 2);
          assert(expressionStack[expressionStack.size() - 1] == curr);
          auto* parent = expressionStack[expressionStack.size() - 2];
          bool parentIsSet = parent->template is<LocalSet>();
          // if the parent of this get is a set, we can sink into the set's
          // value, it would not be nested.
          if (!parentIsSet) {
            return;
          }
        }
      }
      // we can optimize here
      if (!allowNesting && get && !oneUse) {
        // if we can't nest 's a copy with multiple uses, then we can't create
        // a tee, and we can't nop the origin, but we can at least switch to
        // the copied index, which may make the origin unneeded eventually.
        curr->index = get->index;
        anotherCycle = true;
        return;
      }
      // sink it, and nop the origin
      if (oneUse) {
        // with just one use, we can sink just the value
        this->replaceCurrent(set->value);

        // We are replacing a local.get with the value of the local.set. That
        // may require a refinalize in certain cases, like this:
        //
        //  (struct.get $X 0
        //    (local.get $x)
        //  )
        //
        // If we replace the local.get with a more refined type then the
        // struct.get may read a more refined type (if the subtype has a more
        // refined type for that particular field). Note that this cannot happen
        // in the other arm of this if-else, where we replace the local.get with
        // a tee, since tees have the type of the local, so no types change
        // there.
        if (set->value->type != curr->type) {
          refinalize = true;
        }
      } else {
        this->replaceCurrent(set);
        assert(!set->isTee());
        set->makeTee(this->getFunction()->getLocalType(set->index));
      }
      // reuse the local.get that is dying
      *found->second.item = curr;
      ExpressionManipulator::nop(curr);
      sinkables.erase(found);
      anotherCycle = true;
    }
  }